

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O3

bool __thiscall
BlurayHelper::writeBluRayFiles
          (BlurayHelper *this,MuxerManager *muxer,bool usedBlankPL,int mplsNum,int blankNum,
          bool stereoMode)

{
  bool bVar1;
  bool bVar2;
  DiskType DVar3;
  pointer pcVar4;
  void *pvVar5;
  pointer paVar6;
  long *plVar7;
  File *pFVar8;
  bool bVar9;
  byte bVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  ushort val;
  int iVar13;
  uint32_t uVar14;
  uint uVar15;
  uint uVar16;
  MovieObject *movieObj;
  _func_int **pp_Var17;
  pointer this_00;
  pointer pMVar18;
  char cVar19;
  pointer __first;
  vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
  *navCmds;
  undefined8 uVar20;
  long lVar21;
  initializer_list<std::array<unsigned_char,_12UL>_> __l;
  initializer_list<std::array<unsigned_char,_12UL>_> __l_00;
  initializer_list<std::array<unsigned_char,_12UL>_> __l_01;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  SubTrackMode mode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> objectData;
  array<unsigned_char,_4UL> type_indicator;
  array<unsigned_char,_4UL> version_number;
  uint16_t local_1fa;
  File *local_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  allocator_type local_1c9;
  array<unsigned_char,_12UL> local_1c8;
  undefined4 uStack_1bc;
  long local_1b8 [12];
  undefined8 uStack_158;
  pointer local_150;
  undefined8 uStack_148;
  pointer local_140;
  vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
  local_138;
  undefined2 local_120;
  undefined1 local_11e [6];
  vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
  local_118;
  undefined2 local_100;
  undefined1 local_fe;
  vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
  local_f8;
  undefined2 local_e0;
  undefined1 local_de;
  vector<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
  local_d0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  ulong local_a0;
  undefined4 local_98;
  ulong local_94;
  undefined4 local_8c;
  undefined2 local_88;
  undefined8 local_86;
  undefined2 local_7e;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  local_150 = (pointer)CONCAT44(local_150._4_4_,blankNum);
  local_1f0 = local_1e0;
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    pcVar4 = (this->m_dstPath)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,pcVar4,pcVar4 + (this->m_dstPath)._M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
  }
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    local_1f8 = (File *)operator_new(0x38);
    File::File(local_1f8);
  }
  else {
    local_1f8 = (File *)IsoWriter::createFile(this->m_isoWriter);
  }
  if (this->m_dt == BLURAY) {
    bVar9 = isV3();
    if (bVar9) {
      bdIndexData[5] = '3';
      bdIndexData[0xf] = 'x';
      bdIndexData[0x78] = '\0';
      bdIndexData[0x79] = '\0';
      bdIndexData[0x7a] = '\0';
      bdIndexData[0x7b] = ' ';
      bdIndexData[0x7c] = '\0';
      bdIndexData[0x7d] = '\0';
      bdIndexData[0x7e] = '\0';
      bdIndexData[0x7f] = '\x18';
      bdIndexData[0x80] = '\0';
      bdIndexData[0x81] = '\0';
      bdIndexData[0x82] = '\0';
      bdIndexData[0x83] = '\x01';
      bdIndexData[0x84] = '\0';
      bdIndexData[0x85] = '\x03';
      bdIndexData[0x86] = '\0';
      bdIndexData[0x87] = '\x01';
      bdIndexData[0x88] = '\0';
      bdIndexData[0x89] = '\0';
      bdIndexData[0x8a] = '\0';
      bdIndexData[0x8b] = '\x18';
      bdIndexData[0x8c] = '\0';
      bdIndexData[0x8d] = '\0';
      bdIndexData[0x8e] = '\0';
      bdIndexData[0x8f] = '\f';
      bdIndexData[0x90] = '\0';
      bdIndexData[0x91] = '\0';
      bdIndexData[0x92] = '\0';
      bdIndexData[0x93] = '\b';
      bdIndexData[0x94] = ' ';
      bdIndexData[0x95] = '\0';
      bdIndexData[0x96] = '\0';
      bdIndexData[0x97] = '\0';
      bdIndexData[0x98] = '\0';
      bdIndexData[0x99] = '\0';
      bdIndexData[0x9a] = '\0';
      bdIndexData[0x9b] = '\0';
      bVar9 = is4K();
      if (bVar9) {
        bdIndexData[0x94] = 'Q';
      }
      bVar10 = 1;
      if ((V3_flags & 0x1eU) != 0) {
        bVar10 = (byte)V3_flags & 0x1e;
      }
      bdIndexData[0x96] = bVar10;
      uVar20 = 0x9c;
    }
    else {
      bdIndexData[5] = '2';
      uVar20 = 0x78;
    }
  }
  else {
    bdIndexData[5] = '1';
    bdIndexData[0xf] = 'x';
    uVar20 = 0x210;
  }
  bdIndexData[0x2c] = '`';
  if (!stereoMode) {
    bdIndexData[0x2c] = '\0';
  }
  local_1c8._M_elems[0] = (uchar)local_1b8;
  local_1c8._M_elems[1] = (uchar)((ulong)local_1b8 >> 8);
  local_1c8._M_elems._2_2_ = SUB82((ulong)local_1b8 >> 0x10,0);
  local_1c8._M_elems[4] = (uchar)((ulong)local_1b8 >> 0x20);
  local_1c8._M_elems[5] = (uchar)((ulong)local_1b8 >> 0x28);
  local_1c8._M_elems[6] = (uchar)((ulong)local_1b8 >> 0x30);
  local_1c8._M_elems[7] = (uchar)((ulong)local_1b8 >> 0x38);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_1f0,local_1e8 + (long)local_1f0);
  std::__cxx11::string::append((char *)&local_1c8);
  iVar13 = (*(local_1f8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                     (local_1f8,
                      CONCAT17(local_1c8._M_elems[7],
                               CONCAT16(local_1c8._M_elems[6],
                                        CONCAT15(local_1c8._M_elems[5],
                                                 CONCAT14(local_1c8._M_elems[4],
                                                          CONCAT22(local_1c8._M_elems._2_2_,
                                                                   CONCAT11(local_1c8._M_elems[1],
                                                                            local_1c8._M_elems[0])))
                                                ))),2);
  plVar7 = (long *)CONCAT17(local_1c8._M_elems[7],
                            CONCAT16(local_1c8._M_elems[6],
                                     CONCAT15(local_1c8._M_elems[5],
                                              CONCAT14(local_1c8._M_elems[4],
                                                       CONCAT22(local_1c8._M_elems._2_2_,
                                                                CONCAT11(local_1c8._M_elems[1],
                                                                         local_1c8._M_elems[0]))))))
  ;
  if (plVar7 != local_1b8) {
    operator_delete(plVar7,local_1b8[0] + 1);
  }
  pp_Var17 = (local_1f8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream;
  if ((char)iVar13 != '\0') {
    (*pp_Var17[5])(local_1f8,bdIndexData,uVar20);
    (*(local_1f8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])();
    local_1c8._M_elems[0] = (uchar)local_1b8;
    local_1c8._M_elems[1] = (uchar)((ulong)local_1b8 >> 8);
    local_1c8._M_elems._2_2_ = SUB82((ulong)local_1b8 >> 0x10,0);
    local_1c8._M_elems[4] = (uchar)((ulong)local_1b8 >> 0x20);
    local_1c8._M_elems[5] = (uchar)((ulong)local_1b8 >> 0x28);
    local_1c8._M_elems[6] = (uchar)((ulong)local_1b8 >> 0x30);
    local_1c8._M_elems[7] = (uchar)((ulong)local_1b8 >> 0x38);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_1f0,local_1e8 + (long)local_1f0);
    std::__cxx11::string::append((char *)&local_1c8);
    iVar13 = (*(local_1f8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                       (local_1f8,
                        CONCAT17(local_1c8._M_elems[7],
                                 CONCAT16(local_1c8._M_elems[6],
                                          CONCAT15(local_1c8._M_elems[5],
                                                   CONCAT14(local_1c8._M_elems[4],
                                                            CONCAT22(local_1c8._M_elems._2_2_,
                                                                     CONCAT11(local_1c8._M_elems[1],
                                                                              local_1c8._M_elems[0])
                                                                    ))))),2);
    plVar7 = (long *)CONCAT17(local_1c8._M_elems[7],
                              CONCAT16(local_1c8._M_elems[6],
                                       CONCAT15(local_1c8._M_elems[5],
                                                CONCAT14(local_1c8._M_elems[4],
                                                         CONCAT22(local_1c8._M_elems._2_2_,
                                                                  CONCAT11(local_1c8._M_elems[1],
                                                                           local_1c8._M_elems[0]))))
                                      ));
    if (plVar7 != local_1b8) {
      operator_delete(plVar7,local_1b8[0] + 1);
    }
    pp_Var17 = (local_1f8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream;
    if ((char)iVar13 != '\0') {
      (*pp_Var17[5])(local_1f8,bdIndexData,uVar20);
      (*(local_1f8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])();
      DVar3 = this->m_dt;
      local_b8[0] = 'P';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\x01';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\n';
      local_b8._8_8_ = 0x100405000000000;
      local_a8 = 0;
      if (usedBlankPL) {
        uVar14 = my_ntohl((uint32_t)local_150);
        local_a0 = (ulong)uVar14 << 0x20 | 0x8242;
        local_98 = 0xa000000;
      }
      else {
        local_98 = 0;
        local_a0 = 0x1004050;
      }
      uVar14 = my_ntohl(mplsNum);
      local_94 = (ulong)uVar14 << 0x20 | 0x8242;
      local_8c = 0xa000000;
      local_88 = 0x200;
      local_86 = 0;
      local_7e = 0;
      __l._M_len = 5;
      __l._M_array = (iterator)local_b8;
      std::
      vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
      vector(&local_138,__l,(allocator_type *)((long)&uStack_148 + 4));
      local_120 = 1;
      local_11e[0] = 0;
      memcpy(&local_1c8,&DAT_00204a04,0x6c);
      __l_00._M_len = 9;
      __l_00._M_array = &local_1c8;
      std::
      vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
      vector((vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
              *)(local_11e + 6),__l_00,(allocator_type *)&local_1fa);
      local_100 = 1;
      local_fe = 0;
      uStack_48 = 0x8121;
      uStack_44 = 0;
      uStack_58 = 0x1004050ffff0000;
      uStack_50 = 0x4000000;
      local_4c = 0;
      local_68 = 0x100000002000000;
      uStack_60 = 0x300000001004050;
      local_78[0] = 'P';
      local_78[1] = '@';
      local_78[2] = '\0';
      local_78[3] = '\x01';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78._8_8_ = 0x100405000000000;
      __l_01._M_len = 5;
      __l_01._M_array = (iterator)local_78;
      std::
      vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
      vector(&local_f8,__l_01,&local_1c9);
      local_e0 = 1;
      local_de = 0;
      local_d0.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      this_00 = (pointer)operator_new(0x60);
      local_d0.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = this_00 + 3;
      uVar12 = 0;
      lVar21 = 0;
      local_d0.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_start = this_00;
      do {
        std::
        vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
        vector((vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                *)((long)&(this_00->navigationCommands).
                          super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar21),
               (vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                *)((long)&local_138.
                          super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar21));
        (&this_00->titleSearchMask)[lVar21] = (bool)local_11e[lVar21];
        *(undefined2 *)(&this_00->resumeIntentionFlag + lVar21) =
             *(undefined2 *)(local_11e + lVar21 + -2);
        lVar21 = lVar21 + 0x20;
        uVar12 = uVar12 + 1;
      } while (lVar21 != 0x60);
      local_d0.
      super__Vector_base<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ._M_impl.super__Vector_impl_data._M_finish = this_00 + 3;
      local_140 = this_00 + 2;
      lVar21 = 0x60;
      do {
        pvVar5 = *(void **)((long)&uStack_158 + lVar21);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,*(long *)((long)&uStack_148 + lVar21) - (long)pvVar5);
        }
        lVar21 = lVar21 + -0x20;
      } while (lVar21 != 0);
      cVar19 = '\0';
      if (DVar3 == BLURAY) {
        bVar9 = isV3();
        cVar19 = bVar9 + '\x01';
      }
      uVar15 = MuxerManager::getDefaultAudioTrackIdx(muxer);
      uVar16 = MuxerManager::getDefaultSubTrackIdx(muxer,(SubTrackMode *)((long)&uStack_148 + 4));
      if ((uVar16 & uVar15) != 0xffffffff) {
        paVar6 = (this_00->navigationCommands).
                 super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_150 = (pointer)CONCAT44(local_150._4_4_,uStack_148._4_4_);
        local_1c8._M_elems[8] = '\0';
        local_1c8._M_elems[9] = '\0';
        local_1c8._M_elems[10] = '\0';
        local_1c8._M_elems[0xb] = '\0';
        local_1c8._M_elems[0] = 'Q';
        local_1c8._M_elems[1] = 0xc0;
        local_1c8._M_elems[2] = '\0';
        local_1c8._M_elems[3] = '\x01';
        local_1c8._M_elems[4] = 0;
        local_1c8._M_elems[5] = '\0';
        local_1c8._M_elems[6] = '\0';
        local_1c8._M_elems[7] = '\0';
        if (-1 < (int)uVar15) {
          uVar11 = my_ntohs((short)uVar15 + 1);
          local_1c8._M_elems[5] = (uchar)(uVar11 >> 8);
          local_1c8._M_elems[4] = (byte)uVar11 & 0xf | 0x80;
        }
        local_1c8._M_elems[7] = '\0';
        local_1c8._M_elems[6] = 0;
        if ((int)uVar16 < 0) {
          bVar10 = 0x40;
        }
        else {
          uVar11 = my_ntohs((short)uVar16 + 1);
          local_1c8._M_elems[7] = (uchar)(uVar11 >> 8);
          local_1c8._M_elems[8] = '\0';
          local_1c8._M_elems[9] = '\0';
          bVar10 = (byte)uVar11 & 0xf;
          local_1c8._M_elems[6] = bVar10 + 0x80;
          bVar10 = bVar10 | 0xc0;
        }
        if ((uint32_t)local_150 == 0) {
          local_1c8._M_elems[6] = bVar10;
        }
        local_138.
        super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT17(local_1c8._M_elems[7],
                               CONCAT16(local_1c8._M_elems[6],
                                        CONCAT15(local_1c8._M_elems[5],
                                                 CONCAT14(local_1c8._M_elems[4],
                                                          CONCAT22(local_1c8._M_elems._2_2_,
                                                                   CONCAT11(local_1c8._M_elems[1],
                                                                            local_1c8._M_elems[0])))
                                                )));
        local_138.
        super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_138.
                               super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                               CONCAT22(local_1c8._M_elems._10_2_,local_1c8._M_elems._8_2_));
        std::
        vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>::
        _M_insert_rval((vector<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                        *)this_00,paVar6 + 2,(value_type *)&local_138);
      }
      local_b8._0_4_ = 0x4a424f4d;
      uVar15 = 0x30303230;
      if (cVar19 != '\x01') {
        uVar15 = (uint)(cVar19 == '\x02') << 9 | 0x30303130;
      }
      local_78._0_4_ = uVar15;
      local_138.
      super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.
      super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.
      super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar15 = 6;
      pMVar18 = this_00;
      do {
        uVar15 = uVar15 + (((uint)(*(int *)&(pMVar18->navigationCommands).
                                            super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                  *(int *)&(pMVar18->navigationCommands).
                                           super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                           -0x55555555 & 0xffff) * 0xc + 4;
        bVar9 = local_140 != pMVar18;
        pMVar18 = pMVar18 + 1;
      } while (bVar9);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138,
                 (ulong)uVar15 + 0x2c);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_b8,local_b8 + 4,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_78,local_78 + 4,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      uVar14 = my_ntohl(0);
      local_1c8._M_elems[0] = (uchar)uVar14;
      local_1c8._M_elems[1] = (uchar)(uVar14 >> 8);
      local_1c8._M_elems._2_2_ = SUB42(uVar14 >> 0x10,0);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_1c8._M_elems,local_1c8._M_elems + 4,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      local_1c8._M_elems[0] = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138,
                 (long)local_138.
                       super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish +
                 (0x1c - (long)local_138.
                               super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start),local_1c8._M_elems);
      uVar14 = my_ntohl(uVar15);
      local_1c8._M_elems[0] = (uchar)uVar14;
      local_1c8._M_elems[1] = (uchar)(uVar14 >> 8);
      local_1c8._M_elems._2_2_ = SUB42(uVar14 >> 0x10,0);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_1c8._M_elems,local_1c8._M_elems + 4,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      uVar14 = my_ntohl(0);
      local_1c8._M_elems[0] = (uchar)uVar14;
      local_1c8._M_elems[1] = (uchar)(uVar14 >> 8);
      local_1c8._M_elems._2_2_ = SUB42(uVar14 >> 0x10,0);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_1c8._M_elems,local_1c8._M_elems + 4,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      uVar12 = my_ntohs(uVar12);
      local_1c8._M_elems[0] = (uchar)uVar12;
      local_1c8._M_elems[1] = (uchar)(uVar12 >> 8);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_1c8._M_elems,local_1c8._M_elems + 2,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
      do {
        bVar9 = this_00->resumeIntentionFlag;
        bVar1 = this_00->menuCallMask;
        bVar2 = this_00->titleSearchMask;
        val = (short)((long)(this_00->navigationCommands).
                            super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->navigationCommands).
                            super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555;
        local_1c8._M_elems[0] = '\0';
        local_1c8._M_elems[1] = '\0';
        local_1c8._M_elems[2] = '\0';
        local_1c8._M_elems[3] = '\0';
        local_1c8._M_elems[4] = '\0';
        local_1c8._M_elems[5] = '\0';
        local_1c8._M_elems[6] = '\0';
        local_1c8._M_elems[7] = '\0';
        local_1c8._M_elems[8] = '\0';
        local_1c8._M_elems[9] = '\0';
        local_1c8._M_elems[10] = '\0';
        local_1c8._M_elems[0xb] = '\0';
        uStack_1bc = 0;
        local_1b8[0] = 0;
        local_150 = this_00;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,
                   (ulong)val * 0xc + 4);
        local_1fa = my_ntohs((ushort)bVar2 << 0xd | (ushort)bVar1 << 0xe | (ushort)bVar9 << 0xf);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((uchar *)&local_1fa,(uchar *)&local_1f8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
        local_1fa = my_ntohs(val);
        pMVar18 = local_150;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((uchar *)&local_1fa,(uchar *)&local_1f8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
        paVar6 = (pMVar18->navigationCommands).
                 super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        __first = (pMVar18->navigationCommands).
                  super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        while (__first != paVar6) {
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (__first->_M_elems,__first[1]._M_elems,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
          __first = __first + 1;
        }
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((uchar *)CONCAT17(local_1c8._M_elems[7],
                                     CONCAT16(local_1c8._M_elems[6],
                                              CONCAT15(local_1c8._M_elems[5],
                                                       CONCAT14(local_1c8._M_elems[4],
                                                                CONCAT22(local_1c8._M_elems._2_2_,
                                                                         CONCAT11(local_1c8._M_elems
                                                                                  [1],local_1c8.
                                                                                      _M_elems[0])))
                                                      ))),
                   (uchar *)CONCAT44(uStack_1bc,
                                     CONCAT22(local_1c8._M_elems._10_2_,local_1c8._M_elems._8_2_)),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
        pvVar5 = (void *)CONCAT17(local_1c8._M_elems[7],
                                  CONCAT16(local_1c8._M_elems[6],
                                           CONCAT15(local_1c8._M_elems[5],
                                                    CONCAT14(local_1c8._M_elems[4],
                                                             CONCAT22(local_1c8._M_elems._2_2_,
                                                                      CONCAT11(local_1c8._M_elems[1]
                                                                               ,local_1c8._M_elems
                                                                                [0]))))));
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,local_1b8[0] - (long)pvVar5);
        }
        this_00 = pMVar18 + 1;
      } while (local_140 != pMVar18);
      local_1c8._M_elems[0] = (uchar)local_1b8;
      local_1c8._M_elems[1] = (uchar)((ulong)local_1b8 >> 8);
      local_1c8._M_elems._2_2_ = SUB82((ulong)local_1b8 >> 0x10,0);
      local_1c8._M_elems[4] = (uchar)((ulong)local_1b8 >> 0x20);
      local_1c8._M_elems[5] = (uchar)((ulong)local_1b8 >> 0x28);
      local_1c8._M_elems[6] = (uchar)((ulong)local_1b8 >> 0x30);
      local_1c8._M_elems[7] = (uchar)((ulong)local_1b8 >> 0x38);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,local_1f0,local_1e8 + (long)local_1f0);
      std::__cxx11::string::append((char *)&local_1c8);
      pFVar8 = local_1f8;
      iVar13 = (*(local_1f8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream
                 [2])(local_1f8,
                      CONCAT17(local_1c8._M_elems[7],
                               CONCAT16(local_1c8._M_elems[6],
                                        CONCAT15(local_1c8._M_elems[5],
                                                 CONCAT14(local_1c8._M_elems[4],
                                                          CONCAT22(local_1c8._M_elems._2_2_,
                                                                   CONCAT11(local_1c8._M_elems[1],
                                                                            local_1c8._M_elems[0])))
                                                ))),2,0);
      plVar7 = (long *)CONCAT17(local_1c8._M_elems[7],
                                CONCAT16(local_1c8._M_elems[6],
                                         CONCAT15(local_1c8._M_elems[5],
                                                  CONCAT14(local_1c8._M_elems[4],
                                                           CONCAT22(local_1c8._M_elems._2_2_,
                                                                    CONCAT11(local_1c8._M_elems[1],
                                                                             local_1c8._M_elems[0]))
                                                          ))));
      if (plVar7 != local_1b8) {
        operator_delete(plVar7,local_1b8[0] + 1);
      }
      if ((char)iVar13 == '\0') {
LAB_00178292:
        bVar9 = false;
      }
      else {
        (*(pFVar8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                  (pFVar8,local_138.
                          super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                   (ulong)(uint)((int)local_138.
                                      super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (int)local_138.
                                     super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
        (*(pFVar8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])(pFVar8)
        ;
        local_1c8._M_elems[0] = (uchar)local_1b8;
        local_1c8._M_elems[1] = (uchar)((ulong)local_1b8 >> 8);
        local_1c8._M_elems._2_2_ = SUB82((ulong)local_1b8 >> 0x10,0);
        local_1c8._M_elems[4] = (uchar)((ulong)local_1b8 >> 0x20);
        local_1c8._M_elems[5] = (uchar)((ulong)local_1b8 >> 0x28);
        local_1c8._M_elems[6] = (uchar)((ulong)local_1b8 >> 0x30);
        local_1c8._M_elems[7] = (uchar)((ulong)local_1b8 >> 0x38);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,local_1f0,local_1e8 + (long)local_1f0);
        std::__cxx11::string::append((char *)&local_1c8);
        iVar13 = (*(pFVar8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2]
                 )(pFVar8,CONCAT17(local_1c8._M_elems[7],
                                   CONCAT16(local_1c8._M_elems[6],
                                            CONCAT15(local_1c8._M_elems[5],
                                                     CONCAT14(local_1c8._M_elems[4],
                                                              CONCAT22(local_1c8._M_elems._2_2_,
                                                                       CONCAT11(local_1c8._M_elems
                                                                                [1],local_1c8.
                                                                                    _M_elems[0])))))
                                  ),2,0);
        plVar7 = (long *)CONCAT17(local_1c8._M_elems[7],
                                  CONCAT16(local_1c8._M_elems[6],
                                           CONCAT15(local_1c8._M_elems[5],
                                                    CONCAT14(local_1c8._M_elems[4],
                                                             CONCAT22(local_1c8._M_elems._2_2_,
                                                                      CONCAT11(local_1c8._M_elems[1]
                                                                               ,local_1c8._M_elems
                                                                                [0]))))));
        if (plVar7 != local_1b8) {
          operator_delete(plVar7,local_1b8[0] + 1);
        }
        if ((char)iVar13 == '\0') goto LAB_00178292;
        (*(pFVar8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                  (pFVar8,local_138.
                          super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                   (ulong)(uint)((int)local_138.
                                      super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (int)local_138.
                                     super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
        bVar9 = true;
        (*(pFVar8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])(pFVar8)
        ;
      }
      (*(pFVar8->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[1])(pFVar8);
      if (local_138.
          super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.
                        super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_138.
                              super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.
                              super__Vector_base<std::array<unsigned_char,_12UL>,_std::allocator<std::array<unsigned_char,_12UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<(anonymous_namespace)::MovieObject,_std::allocator<(anonymous_namespace)::MovieObject>_>
      ::~vector(&local_d0);
      goto LAB_001782c7;
    }
  }
  (*pp_Var17[1])();
  bVar9 = false;
LAB_001782c7:
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  return bVar9;
}

Assistant:

bool BlurayHelper::writeBluRayFiles(const MuxerManager& muxer, const bool usedBlankPL, const int mplsNum,
                                    const int blankNum, const bool stereoMode) const
{
    int fileSize = sizeof(bdIndexData);
    const string prefix = m_isoWriter ? "" : m_dstPath;
    AbstractOutputStream* file;
    if (m_isoWriter)
        file = m_isoWriter->createFile();
    else
        file = new File();

    if (m_dt == DiskType::BLURAY)
    {
        if (isV3())
        {
            bdIndexData[5] = '3';
            fileSize = 0x9C;         // add 36 bytes for UHD data extension
            bdIndexData[15] = 0x78;  // start address of UHD data extension

            // UHD data extension
            uint8_t* V3metaData = bdIndexData + 0x78;
            static constexpr char metaData[37] =
                "\x00\x00\x00\x20\x00\x00\x00\x18\x00\x00\x00\x01"
                "\x00\x03\x00\x01\x00\x00\x00\x18\x00\x00\x00\x0C"
                "\x00\x00\x00\x08\x20\x00\x00\x00\x00\x00\x00\x00";
            for (int i = 0; i < 36; i++) V3metaData[i] = metaData[i];

            // 4K => 66/100 GB Disk, 109 MB/s Recording_Rate
            if (is4K())
                bdIndexData[0x94] = 0x51;
            // include HDR flags
            bdIndexData[0x96] = (V3_flags & 0x1e);
            // no HDR10 detected => SDR flag
            if (bdIndexData[0x96] == 0)
                bdIndexData[0x96] = 1;
        }
        else  // V2 Blu-ray
        {
            bdIndexData[5] = '2';
            fileSize = 0x78;
        }
    }
    else
    {
        bdIndexData[5] = '1';
        bdIndexData[15] = 0x78;
    }
    bdIndexData[0x2c] = stereoMode ? 0x60 : 0;  // set initial_output_mode_preference and SS_content_exist_flag

    if (!file->open((prefix + "BDMV/index.bdmv").c_str(), AbstractOutputStream::ofWrite))
    {
        delete file;
        return false;
    }
    file->write(bdIndexData, fileSize);
    file->close();

    if (!file->open((prefix + "BDMV/BACKUP/index.bdmv").c_str(), File::ofWrite))
    {
        delete file;
        return false;
    }
    file->write(bdIndexData, fileSize);
    file->close();

    return writeBdMovieObjectData(muxer, file, prefix, m_dt, usedBlankPL, mplsNum, blankNum);
}